

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
utf32_2_str(sexp_conflict ctx,char *bv,int len,sexp_conflict endianness,int endianness_mandatory)

{
  int iVar1;
  sexp_conflict psVar2;
  long in_RCX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar3;
  uchar *dst;
  sexp_conflict res;
  sexp_sint_t start;
  sexp_sint_t utf8_len;
  sexp_sint_t ch_len;
  sexp_sint_t i;
  uint32_t ch;
  int swap;
  uint32_t local_70;
  uint32_t local_6c;
  uchar *local_68;
  long local_58;
  long local_50;
  long local_40;
  
  bVar3 = in_RCX != *(long *)(*(long *)(in_RDI + 0x28) + 0x18);
  local_50 = 0;
  local_58 = 0;
  if ((in_R8D == 0) && (3 < in_EDX)) {
    if (*in_RSI == -0x20000) {
      bVar3 = true;
      local_58 = 4;
    }
    else if (*in_RSI == 0xfeff) {
      local_58 = 4;
    }
  }
  for (local_40 = local_58; local_40 + 3 < (long)in_EDX; local_40 = local_40 + 4) {
    if (bVar3) {
      local_6c = sexp_swap_u32(*(uint32_t *)((long)in_RSI + local_40));
    }
    else {
      local_6c = *(uint32_t *)((long)in_RSI + local_40);
    }
    iVar1 = utf8_char_byte_count(local_6c);
    local_50 = iVar1 + local_50;
  }
  psVar2 = (sexp_conflict)sexp_make_string_op(in_RDI,0,2,local_50 << 1 | 1,0x43e);
  if (((psVar2 != (sexp_conflict)0x0) && (((ulong)psVar2 & 3) == 0)) && (psVar2->tag == 9)) {
    local_68 = &(((psVar2->value).type.name)->value).uvector.element_type +
               (long)(psVar2->value).type.cpl;
    for (local_40 = local_58; local_40 + 3 < (long)in_EDX; local_40 = local_40 + 4) {
      if (bVar3) {
        local_70 = sexp_swap_u32(*(uint32_t *)((long)in_RSI + local_40));
      }
      else {
        local_70 = *(uint32_t *)((long)in_RSI + local_40);
      }
      iVar1 = utf8_char_byte_count(local_70);
      utf8_encode_char(local_68,iVar1,local_70);
      local_68 = local_68 + iVar1;
    }
  }
  return psVar2;
}

Assistant:

sexp utf32_2_str(sexp ctx, char* bv, int len, sexp endianness, int endianness_mandatory) {
  int swap = endianness != sexp_global(ctx, SEXP_G_ENDIANNESS);
  uint32_t ch;
  sexp_sint_t i, ch_len, utf8_len=0, start=0;
  sexp res;
  unsigned char* dst;
  if (!endianness_mandatory && len>3) {
    ch = *(uint32_t*)(bv);
    if (ch == 0xFFFE0000) {
      swap = 1;
      start = 4;
    } else if (ch == 0xFEFF) {
      start = 4;
    }
  }
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    utf8_len += utf8_char_byte_count(ch);
  }
  res = sexp_make_string(ctx, sexp_make_fixnum(utf8_len), SEXP_VOID);
  if (!(res && sexp_stringp(res))) return res;
  dst = (unsigned char*) sexp_string_data(res);
  for (i=start; i+3<len; i+=4) {
    ch = swap ? sexp_swap_u32(*((uint32_t*)(bv+i))) : *((uint32_t*)(bv+i));
    ch_len = utf8_char_byte_count(ch);
    utf8_encode_char(dst, ch_len, ch);
    dst += ch_len;
  }
  return res;
}